

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O1

void just_test_test_case_f_test_split_lines(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  pointer *ppbVar6;
  output_file *poVar7;
  char *s_;
  char *s__00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__01;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__03;
  basic_file_view<false> *c__04;
  char *s__02;
  char *s__03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__04;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c__05;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__06;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__07;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__08;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__09;
  basic_file_view<false> *c__10;
  char (*s__05) [8];
  char (*s__06) [9];
  char (*s__07) [9];
  char (*s__08) [8];
  char (*s__09) [9];
  char (*s__10) [9];
  char (*s__11) [9];
  char (*s__12) [11];
  char (*s__13) [11];
  char (*s__14) [9];
  char (*s__15) [10];
  char (*s__16) [10];
  char (*s__17) [10];
  char (*s__18) [10];
  char (*s__19) [2];
  char (*s__20) [2];
  char *s__21;
  char *s__22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__23;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c__11;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__12;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__13;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__14;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__15;
  basic_file_view<false> *c__16;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  view1;
  size_type __dnew;
  string path;
  string str;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view5;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view4;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view3;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  directory tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  basic_file_view<false> view6;
  ifstream fs2;
  istringstream s1;
  ifstream fs1;
  istringstream s2;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view5_2;
  ifstream fs3;
  istringstream s3;
  pointer *local_f68;
  pointer local_f60;
  pointer local_f58 [2];
  assert_equal_container local_f48;
  pointer local_f20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f18;
  string local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  long *local_ec0;
  long local_eb8;
  long local_eb0 [2];
  value_type local_ea0;
  assert_equal_container local_e80;
  istringstream *local_e58;
  output_file *local_e50;
  output_file *local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e40;
  string_list_builder local_e38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_df0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_da8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d90;
  type local_d78;
  undefined1 local_d60 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d40;
  directory local_d28;
  string_list_builder local_d08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cf0;
  value_type local_cd8 [16];
  undefined1 *local_ad0;
  void *local_ac8;
  undefined1 local_ac0;
  undefined1 uStack_abf;
  undefined1 uStack_abe;
  undefined1 uStack_abd;
  undefined4 uStack_abc;
  undefined1 local_8c8 [120];
  ios_base local_850 [264];
  output_file local_748 [13];
  string_list_builder local_540 [5];
  ios_base local_4c8 [264];
  undefined1 **local_3c0;
  value_type local_3b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0 [5];
  ios_base local_138 [264];
  
  local_ec0 = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e80._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e80._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e80,local_ec0,local_eb8 + (long)local_ec0);
  local_e80._assert_msg._line = 0x85;
  local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea0,"");
  poVar7 = local_748;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d08._list,1,&local_ea0,(allocator_type *)poVar7);
  just::temp::directory::directory(&local_d28);
  local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,local_d28._path._M_dataplus._M_p,
             local_d28._path._M_dataplus._M_p + local_d28._path._M_string_length);
  std::__cxx11::string::append((char *)&local_f00);
  local_ad0 = &local_ac0;
  local_ac8 = (void *)0x0;
  local_ac0 = 0;
  just::file::impl::output_file::output_file(local_748,&local_f00);
  just::file::impl::output_file::write(local_748,(int)local_ad0,local_ac8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_748);
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_748,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_ad0,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  paVar1 = &local_cd8[0].field_2;
  local_cd8[0]._M_string_length = 0;
  local_cd8[0].field_2._M_local_buf[0] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c8,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0]._M_string_length = 0;
  local_cd8[0].field_2._M_local_buf[0] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::istringstream::istringstream((istringstream *)local_540,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0]._M_string_length = 0;
  local_cd8[0].field_2._M_local_buf[0] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  local_ee0._M_string_length = 0;
  local_ee0.field_2._M_local_buf[0] = '\0';
  local_f20 = &local_ee0;
  local_e58 = (istringstream *)&local_ad0;
  local_e50 = (output_file *)local_540;
  local_e48 = local_748;
  local_e40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8;
  std::ifstream::ifstream(local_cd8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_e38._list,(lines *)0x1221de,s_);
  paVar2 = &local_cd8[0].field_2;
  just::lines::split<false,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60,(lines *)0x1221de,s__00);
  paVar1 = &local_f48._assert_msg._filename.field_2;
  local_f48._assert_msg._filename._M_string_length = 0;
  local_f48._assert_msg._filename.field_2._M_local_buf[0] = '\0';
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d78,(lines *)&local_f48,s__01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_d90,(istream *)local_1b0);
  just::lines::split<false>(&local_da8,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_dc0,&local_f00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_dd8,(_anonymous_namespace_ *)&local_f20,c_);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_df0,(_anonymous_namespace_ *)&local_e40,c__00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e08,(_anonymous_namespace_ *)&local_e48,c__01);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e20,(_anonymous_namespace_ *)&local_e50,c__02);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d40,(_anonymous_namespace_ *)&local_e58,c__03);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_cf0,(_anonymous_namespace_ *)local_cd8,c__04);
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e38._list,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60,&local_d78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d78,&local_d90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d90,&local_da8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_da8,&local_dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dc0,&local_dd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dd8,&local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_df0,&local_e08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e08,&local_e20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e20,&local_d40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cf0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_df0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d60);
  std::ifstream::~ifstream(local_cd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p,
                    CONCAT44(local_ee0.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ee0.field_2._M_local_buf[3],
                                      CONCAT12(local_ee0.field_2._M_local_buf[2],
                                               CONCAT11(local_ee0.field_2._M_local_buf[1],
                                                        local_ee0.field_2._M_local_buf[0])))) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_540);
  std::ios_base::~ios_base(local_4c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c8);
  std::ios_base::~ios_base(local_850);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_ad0);
  std::ifstream::~ifstream(local_748);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory(&local_d28);
  just::test::assert_equal_container::operator()(&local_e80,&local_d08,&local_e38._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e38._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._assert_msg._filename._M_dataplus._M_p !=
      &local_e80._assert_msg._filename.field_2) {
    operator_delete(local_e80._assert_msg._filename._M_dataplus._M_p,
                    local_e80._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ec0 != local_eb0) {
    operator_delete(local_ec0,local_eb0[0] + 1);
  }
  local_ec0 = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e80._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e80._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e80,local_ec0,local_eb8 + (long)local_ec0);
  local_e80._assert_msg._line = 0x86;
  local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea0,"foo","");
  poVar7 = local_748;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d08._list,1,&local_ea0,(allocator_type *)poVar7);
  just::temp::directory::directory(&local_d28);
  local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,local_d28._path._M_dataplus._M_p,
             local_d28._path._M_dataplus._M_p + local_d28._path._M_string_length);
  std::__cxx11::string::append((char *)&local_f00);
  local_ad0 = &local_ac0;
  local_ac0 = 0x66;
  uStack_abf = 0x6f;
  uStack_abe = 0x6f;
  uStack_abd = 0;
  local_ac8 = (void *)0x3;
  just::file::impl::output_file::output_file(local_748,&local_f00);
  just::file::impl::output_file::write(local_748,(int)local_ad0,local_ac8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_748);
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_748,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_ad0,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  local_cd8[0].field_2._M_local_buf[0] = 'f';
  local_cd8[0].field_2._M_local_buf[1] = 'o';
  local_cd8[0].field_2._M_local_buf[2] = 'o';
  local_cd8[0].field_2._M_local_buf[3] = '\0';
  local_cd8[0]._M_string_length = 3;
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c8,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0].field_2._M_local_buf[0] = 'f';
  local_cd8[0].field_2._M_local_buf[1] = 'o';
  local_cd8[0].field_2._M_local_buf[2] = 'o';
  local_cd8[0].field_2._M_local_buf[3] = '\0';
  local_cd8[0]._M_string_length = 3;
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_540,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0].field_2._M_local_buf[0] = 'f';
  local_cd8[0].field_2._M_local_buf[1] = 'o';
  local_cd8[0].field_2._M_local_buf[2] = 'o';
  local_cd8[0].field_2._M_local_buf[3] = '\0';
  local_cd8[0]._M_string_length = 3;
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  local_ee0.field_2._M_local_buf[0] = 'f';
  local_ee0.field_2._M_local_buf[1] = 'o';
  local_ee0.field_2._M_local_buf[2] = 'o';
  local_ee0.field_2._M_local_buf[3] = '\0';
  local_ee0._M_string_length = 3;
  local_f20 = &local_ee0;
  local_e58 = (istringstream *)&local_ad0;
  local_e50 = (output_file *)local_540;
  local_e48 = local_748;
  local_e40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8;
  std::ifstream::ifstream(local_cd8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_e38._list,(lines *)"foo",s__02);
  paVar2 = &local_cd8[0].field_2;
  just::lines::split<false,char_const>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60,(lines *)"foo",s__03);
  local_f48._assert_msg._filename.field_2._M_local_buf[0] = 'f';
  local_f48._assert_msg._filename.field_2._M_local_buf[1] = 'o';
  local_f48._assert_msg._filename.field_2._M_local_buf[2] = 'o';
  local_f48._assert_msg._filename.field_2._M_local_buf[3] = '\0';
  local_f48._assert_msg._filename._M_string_length = 3;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d78,(lines *)&local_f48,s__04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_d90,(istream *)local_1b0);
  just::lines::split<false>(&local_da8,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_dc0,&local_f00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_dd8,(_anonymous_namespace_ *)&local_f20,c__05);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_df0,(_anonymous_namespace_ *)&local_e40,c__06);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e08,(_anonymous_namespace_ *)&local_e48,c__07);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e20,(_anonymous_namespace_ *)&local_e50,c__08);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d40,(_anonymous_namespace_ *)&local_e58,c__09);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_cf0,(_anonymous_namespace_ *)local_cd8,c__10);
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e38._list,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d60,&local_d78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d78,&local_d90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d90,&local_da8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_da8,&local_dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dc0,&local_dd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dd8,&local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_df0,&local_e08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e08,&local_e20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f18);
  pbVar5 = local_f18.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f58[0] = local_f18.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e20,&local_d40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cf0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_df0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d60);
  std::ifstream::~ifstream(local_cd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p,
                    CONCAT44(local_ee0.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ee0.field_2._M_local_buf[3],
                                      CONCAT12(local_ee0.field_2._M_local_buf[2],
                                               CONCAT11(local_ee0.field_2._M_local_buf[1],
                                                        local_ee0.field_2._M_local_buf[0])))) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_540);
  std::ios_base::~ios_base(local_4c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c8);
  std::ios_base::~ios_base(local_850);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_ad0);
  std::ifstream::~ifstream(local_748);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory(&local_d28);
  just::test::assert_equal_container::operator()(&local_e80,&local_d08,&local_e38._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e38._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._assert_msg._filename._M_dataplus._M_p !=
      &local_e80._assert_msg._filename.field_2) {
    operator_delete(local_e80._assert_msg._filename._M_dataplus._M_p,
                    local_e80._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ec0 != local_eb0) {
    operator_delete(local_ec0,local_eb0[0] + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  paVar3 = &local_748[0]._filename.field_2;
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x88;
  paVar4 = &local_3b8[0].field_2;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c8,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c8,local_cd8);
  (anonymous_namespace)::split_lines<false,8>
            (&local_540[0]._list,(_anonymous_namespace_ *)"foo\nbar",s__05);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,(string_list_builder *)local_8c8,
             &local_540[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x89;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  pbVar5 = (pointer)(local_8c8 + 0x10);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\n\nbar",s__06)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x8d;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\nbar\n",s__07)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x92;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c8,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c8,local_cd8);
  (anonymous_namespace)::split_lines<false,8>
            (&local_540[0]._list,(_anonymous_namespace_ *)"foo\rbar",s__08);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,(string_list_builder *)local_8c8,
             &local_540[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x96;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\r\rbar",s__09)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x9a;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\rbar\r",s__10)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0x9f;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c8,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c8,local_cd8);
  (anonymous_namespace)::split_lines<false,9>
            (&local_540[0]._list,(_anonymous_namespace_ *)"foo\r\nbar",s__11);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,(string_list_builder *)local_8c8,
             &local_540[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xa3;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,11>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\r\nbar",s__12);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xa7;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,11>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\nbar\r\n",s__13);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xac;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,9>(local_1b0,(_anonymous_namespace_ *)"foo\n\rbar",s__14)
  ;
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xb0;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\n\r\nbar",s__15);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xb4;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\r\nbar",s__16);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xb8;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\rbar",s__17);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xbc;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"foo","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_540[0]._list,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,local_cd8);
  local_8c8._0_8_ = pbVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"bar","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_540[0]._list,(value_type *)local_8c8);
  (anonymous_namespace)::split_lines<false,10>
            (local_1b0,(_anonymous_namespace_ *)"foo\r\n\nbar",s__18);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,local_540,local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1b0);
  if ((pointer)local_8c8._0_8_ != pbVar5) {
    operator_delete((void *)local_8c8._0_8_,(ulong)(local_8c8._16_8_ + 1));
  }
  paVar2 = &local_cd8[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xc1;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c8,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c8,local_cd8);
  (anonymous_namespace)::split_lines<false,2>
            (&local_540[0]._list,(_anonymous_namespace_ *)0x1221dd,s__19);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,(string_list_builder *)local_8c8,
             &local_540[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ad0 = &local_ac0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_748[0]._filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_748,local_ad0,(undefined1 *)((long)local_ac8 + (long)local_ad0));
  local_748[0]._f._0_4_ = 0xc2;
  local_3b8[0]._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_8c8,1,local_3b8,(allocator_type *)local_cd8);
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd8,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_8c8,local_cd8);
  (anonymous_namespace)::split_lines<false,2>
            (&local_540[0]._list,(_anonymous_namespace_ *)0x1221d7,s__20);
  just::test::assert_equal_container::operator()
            ((assert_equal_container *)local_748,(string_list_builder *)local_8c8,
             &local_540[0]._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540[0]._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_8c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != paVar4) {
    operator_delete(local_3b8[0]._M_dataplus._M_p,local_3b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748[0]._filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_748[0]._filename._M_dataplus._M_p,
                    local_748[0]._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  local_ec0 = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e80._assert_msg._filename._M_dataplus._M_p =
       (pointer)&local_e80._assert_msg._filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e80,local_ec0,local_eb8 + (long)local_ec0);
  local_e80._assert_msg._line = 0xc3;
  local_ea0._M_dataplus._M_p = (pointer)&local_ea0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea0,"");
  poVar7 = local_748;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e38._list,1,&local_ea0,(allocator_type *)poVar7);
  local_d60._0_8_ = local_d60 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d60,"");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e38._list,(value_type *)local_d60);
  just::temp::directory::directory(&local_d28);
  local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,local_d28._path._M_dataplus._M_p,
             local_d28._path._M_dataplus._M_p + local_d28._path._M_string_length);
  std::__cxx11::string::append((char *)&local_f00);
  local_ad0 = &local_ac0;
  local_ac0 = 0xd;
  uStack_abf = 10;
  local_ac8 = (void *)0x2;
  uStack_abe = 0;
  just::file::impl::output_file::output_file(local_748,&local_f00);
  just::file::impl::output_file::write(local_748,(int)local_ad0,local_ac8,(size_t)poVar7);
  just::file::impl::output_file::~output_file(local_748);
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,
                    CONCAT44(uStack_abc,
                             CONCAT13(uStack_abd,CONCAT12(uStack_abe,CONCAT11(uStack_abf,local_ac0))
                                     )) + 1);
  }
  std::ifstream::ifstream(local_748,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_ad0,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_3b8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  local_cd8[0].field_2._M_local_buf[0] = '\r';
  local_cd8[0].field_2._M_local_buf[1] = '\n';
  local_cd8[0]._M_string_length = 2;
  local_cd8[0].field_2._M_local_buf[2] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_8c8,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0].field_2._M_local_buf[0] = '\r';
  local_cd8[0].field_2._M_local_buf[1] = '\n';
  local_cd8[0]._M_string_length = 2;
  local_cd8[0].field_2._M_local_buf[2] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_540,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_cd8[0].field_2._M_local_buf[0] = '\r';
  local_cd8[0].field_2._M_local_buf[1] = '\n';
  local_cd8[0]._M_string_length = 2;
  local_cd8[0].field_2._M_local_buf[2] = '\0';
  local_cd8[0]._M_dataplus._M_p = (pointer)&local_cd8[0].field_2;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_cd8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8[0]._M_dataplus._M_p != &local_cd8[0].field_2) {
    operator_delete(local_cd8[0]._M_dataplus._M_p,
                    CONCAT44(local_cd8[0].field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_cd8[0].field_2._M_local_buf[3],
                                      CONCAT12(local_cd8[0].field_2._M_local_buf[2],
                                               CONCAT11(local_cd8[0].field_2._M_local_buf[1],
                                                        local_cd8[0].field_2._M_local_buf[0])))) + 1
                   );
  }
  local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
  local_ee0.field_2._M_local_buf[0] = '\r';
  local_ee0.field_2._M_local_buf[1] = '\n';
  local_ee0._M_string_length = 2;
  local_ee0.field_2._M_local_buf[2] = '\0';
  local_e40 = &local_ee0;
  local_e58 = (istringstream *)local_540;
  local_e50 = local_748;
  local_e48 = (output_file *)local_8c8;
  local_3c0 = &local_ad0;
  std::ifstream::ifstream(local_cd8,local_f00._M_dataplus._M_p,_S_in|_S_bin);
  just::lines::split<false,char_const>(&local_f18,(lines *)0x1221dc,s__21);
  just::lines::split<false,char_const>(&local_d78,(lines *)0x1221dc,s__22);
  local_f48._assert_msg._filename.field_2._M_local_buf[0] = '\r';
  local_f48._assert_msg._filename.field_2._M_local_buf[1] = '\n';
  local_f48._assert_msg._filename._M_string_length = 2;
  local_f48._assert_msg._filename.field_2._M_local_buf[2] = '\0';
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  just::lines::split<false,std::__cxx11::string>(&local_d90,(lines *)&local_f48,s__23);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  just::lines::split<false>(&local_da8,(istream *)local_1b0);
  just::lines::split<false>(&local_dc0,(istream *)local_3b8);
  just::lines::split_lines_of_file<false>(&local_dd8,&local_f00);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_df0,(_anonymous_namespace_ *)&local_e40,c__11);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e08,(_anonymous_namespace_ *)&local_e48,c__12);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e20,(_anonymous_namespace_ *)&local_e50,c__13);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d40,(_anonymous_namespace_ *)&local_e58,c__14);
  (anonymous_namespace)::create_vector<just::lines::basic_view<std::istream,false>>
            (&local_cf0,(_anonymous_namespace_ *)&local_3c0,c__15);
  (anonymous_namespace)::create_vector<just::lines::basic_file_view<false>>
            (&local_d08._list,(_anonymous_namespace_ *)local_cd8,c__16);
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_f18,&local_d78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d78,&local_d90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d90,&local_da8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_da8,&local_dc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dc0,&local_dd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_dd8,&local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_df0,&local_e08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e08,&local_e20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_e20,&local_d40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  local_f20 = (pointer)0x66;
  local_f68 = local_f58;
  ppbVar6 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_f68,(ulong)&local_f20);
  pbVar5 = local_f20;
  local_f58[0] = local_f20;
  local_f68 = ppbVar6;
  memcpy(ppbVar6,
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
         ,0x66);
  local_f60 = pbVar5;
  *(undefined1 *)((long)ppbVar6 + (long)pbVar5) = 0;
  local_f48._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f48,local_f68,(long)&(pbVar5->_M_dataplus)._M_p + (long)local_f68);
  local_f48._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f48,&local_d40,&local_cf0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f48._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f48._assert_msg._filename._M_dataplus._M_p,
                    CONCAT44(local_f48._assert_msg._filename.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_f48._assert_msg._filename.field_2._M_local_buf[3],
                                      CONCAT12(local_f48._assert_msg._filename.field_2._M_local_buf
                                               [2],CONCAT11(local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[1],
                                                            local_f48._assert_msg._filename.field_2.
                                                            _M_local_buf[0])))) + 1);
  }
  if (local_f68 != local_f58) {
    operator_delete(local_f68,(ulong)((long)&(local_f58[0]->_M_dataplus)._M_p + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08._list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cf0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_df0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d78);
  std::ifstream::~ifstream(local_cd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
    operator_delete(local_ee0._M_dataplus._M_p,
                    CONCAT44(local_ee0.field_2._M_allocated_capacity._4_4_,
                             CONCAT13(local_ee0.field_2._M_local_buf[3],
                                      CONCAT12(local_ee0.field_2._M_local_buf[2],
                                               CONCAT11(local_ee0.field_2._M_local_buf[1],
                                                        local_ee0.field_2._M_local_buf[0])))) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_540);
  std::ios_base::~ios_base(local_4c8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_8c8);
  std::ios_base::~ios_base(local_850);
  std::ifstream::~ifstream(local_3b8);
  std::ifstream::~ifstream(&local_ad0);
  std::ifstream::~ifstream(local_748);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
    operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory(&local_d28);
  just::test::assert_equal_container::operator()(&local_e80,&local_e38,&local_f18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f18);
  if ((pointer)local_d60._0_8_ != (pointer)(local_d60 + 0x10)) {
    operator_delete((void *)local_d60._0_8_,(ulong)(local_d60._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e38._list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea0._M_dataplus._M_p != &local_ea0.field_2) {
    operator_delete(local_ea0._M_dataplus._M_p,local_ea0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e80._assert_msg._filename._M_dataplus._M_p !=
      &local_e80._assert_msg._filename.field_2) {
    operator_delete(local_e80._assert_msg._filename._M_dataplus._M_p,
                    local_e80._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_ec0 != local_eb0) {
    operator_delete(local_ec0,local_eb0[0] + 1);
  }
  return;
}

Assistant:

JUST_TEST_CASE(test_split_lines_keeping_new_line)
{
  typedef string_list_builder v;

  JUST_ASSERT_EQUAL_CONTAINER(v(""), split_lines<true>(""));
  JUST_ASSERT_EQUAL_CONTAINER(v("foo"), split_lines<true>("foo"));

  JUST_ASSERT_EQUAL_CONTAINER(v("foo\n")("bar"), split_lines<true>("foo\nbar"));
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\n")("bar"),
    split_lines<true>("foo\n\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("bar\n")(""),
    split_lines<true>("foo\nbar\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar"),
    split_lines<true>("foo\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r")("bar"),
    split_lines<true>("foo\r\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("bar\r")(""),
    split_lines<true>("foo\rbar\r")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar"),
    split_lines<true>("foo\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r\n")("bar"),
    split_lines<true>("foo\r\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("bar\r\n")(""),
    split_lines<true>("foo\r\nbar\r\n")
  );

  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r")("bar"),
    split_lines<true>("foo\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\n")("\r\n")("bar"),
    split_lines<true>("foo\n\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r")("\r\n")("bar"),
    split_lines<true>("foo\r\r\nbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\r")("bar"),
    split_lines<true>("foo\r\n\rbar")
  );
  JUST_ASSERT_EQUAL_CONTAINER(
    v("foo\r\n")("\n")("bar"),
    split_lines<true>("foo\r\n\nbar")
  );

  JUST_ASSERT_EQUAL_CONTAINER(v("\n")(""), split_lines<true>("\n"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r")(""), split_lines<true>("\r"));
  JUST_ASSERT_EQUAL_CONTAINER(v("\r\n")(""), split_lines<true>("\r\n"));
}